

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O1

bool __thiscall ON_Matrix::Scale(ON_Matrix *this,double s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  
  iVar1 = this->m_row_count;
  iVar2 = this->m_col_count;
  piVar5 = (int *)this->m_cmem;
  if (piVar5 != (int *)0x0 && (0 < iVar2 && 0 < iVar1)) {
    do {
      lVar4 = *(long *)(piVar5 + 2);
      if ((lVar4 != 0) && (iVar3 = *piVar5, 0 < iVar3)) {
        lVar6 = 0;
        do {
          *(double *)(lVar4 + lVar6 * 8) = *(double *)(lVar4 + lVar6 * 8) * s;
          lVar6 = lVar6 + 1;
        } while (iVar3 != (int)lVar6);
      }
      piVar5 = *(int **)(piVar5 + 4);
    } while (piVar5 != (int *)0x0);
  }
  return 0 < iVar2 && 0 < iVar1;
}

Assistant:

bool ON_Matrix::Scale( double s )
{
  bool rc = false;
  if ( m_row_count > 0 && m_col_count > 0 ) 
  {
    struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
    int i;
    double* p;
    while ( 0 != cmem )
    {
      if ( 0 != cmem->a && cmem->count > 0 )
      {
        p = cmem->a;
        i = cmem->count;
        while(i--)
          *p++ *= s;
      }
      cmem = cmem->next;
    }
    rc = true;
  }
  /*
  int i = m_a.Capacity();
  if ( m_row_count > 0 && m_col_count > 0 && m_row_count*m_col_count <= i ) {
    double* p = m_a.Array();
    while ( i-- )
      *p++ *= s;
    rc = true;
  }
  */
  return rc;
}